

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O0

int gost_mac_iv(gost_ctx *ctx,int mac_len,uchar *iv,uchar *data,uint data_len,uchar *mac)

{
  long in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  uint in_R8D;
  gost_ctx *in_R9;
  uint i;
  byte buf2 [8];
  byte buffer [8];
  uint local_44;
  byte *in_stack_ffffffffffffffc0;
  byte *buffer_00;
  
  buffer_00 = (byte *)*in_RDX;
  for (local_44 = 0; local_44 + 8 <= in_R8D; local_44 = local_44 + 8) {
    mac_block(in_R9,buffer_00,in_stack_ffffffffffffffc0);
  }
  if (local_44 < in_R8D) {
    memset(&stack0xffffffffffffffc0,0,8);
    memcpy(&stack0xffffffffffffffc0,(void *)(in_RCX + (ulong)local_44),(ulong)(in_R8D - local_44));
    mac_block(in_R9,buffer_00,in_stack_ffffffffffffffc0);
    local_44 = local_44 + 8;
  }
  if (local_44 == 8) {
    memset(&stack0xffffffffffffffc0,0,8);
    mac_block(in_R9,buffer_00,in_stack_ffffffffffffffc0);
  }
  get_mac(&stack0xffffffffffffffc8,in_ESI,(byte *)in_R9);
  return 1;
}

Assistant:

int gost_mac_iv(gost_ctx * ctx, int mac_len, const unsigned char *iv,
                const unsigned char *data, unsigned int data_len,
                unsigned char *mac)
{
    byte buffer[8];
    byte buf2[8];
    unsigned int i;
    memcpy(buffer, iv, 8);
    for (i = 0; i + 8 <= data_len; i += 8)
        mac_block(ctx, buffer, data + i);
    if (i < data_len) {
        memset(buf2, 0, 8);
        memcpy(buf2, data + i, data_len - i);
        mac_block(ctx, buffer, buf2);
        i += 8;
    }
    if (i == 8) {
        memset(buf2, 0, 8);
        mac_block(ctx, buffer, buf2);
    }
    get_mac(buffer, mac_len, mac);
    return 1;
}